

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_lpf2_init_preallocated(ma_lpf2_config *pConfig,void *pHeap,ma_lpf2 *pLPF)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ma_format local_f8;
  ma_uint32 local_f4;
  ma_biquad_config bqConfig_1;
  ma_biquad_config bqConfig;
  ma_result result;
  ma_lpf2 *pLPF_local;
  void *pHeap_local;
  ma_lpf2_config *pConfig_local;
  double a;
  double c;
  double s;
  double w;
  double q;
  
  if (pLPF == (ma_lpf2 *)0x0) {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    memset(pLPF,0,0x40);
    if (pConfig == (ma_lpf2_config *)0x0) {
      pConfig_local._4_4_ = MA_INVALID_ARGS;
    }
    else {
      if (pConfig == (ma_lpf2_config *)0x0) {
        __assert_fail("pConfig != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x82f8,"ma_biquad_config ma_lpf2__get_biquad_config(const ma_lpf2_config *)")
        ;
      }
      dVar1 = pConfig->q;
      dVar2 = (pConfig->cutoffFrequency * 6.283185307179586) / (double)pConfig->sampleRate;
      dVar3 = sin(dVar2);
      dVar2 = sin(1.5707963267948966 - dVar2);
      dVar3 = dVar3 / (dVar1 * 2.0);
      bqConfig_1._0_8_ = (1.0 - dVar2) / 2.0;
      bqConfig_1.b0 = 1.0 - dVar2;
      bqConfig_1.b1 = (1.0 - dVar2) / 2.0;
      bqConfig_1.b2 = dVar3 + 1.0;
      bqConfig_1.a0 = dVar2 * -2.0;
      bqConfig_1.a1 = 1.0 - dVar3;
      local_f8 = pConfig->format;
      local_f4 = pConfig->channels;
      memcpy(&bqConfig_1.a2,&local_f8,0x38);
      pConfig_local._4_4_ =
           ma_biquad_init_preallocated((ma_biquad_config *)&bqConfig_1.a2,pHeap,&pLPF->bq);
      if (pConfig_local._4_4_ == MA_SUCCESS) {
        pConfig_local._4_4_ = MA_SUCCESS;
      }
    }
  }
  return pConfig_local._4_4_;
}

Assistant:

MA_API ma_result ma_lpf2_init_preallocated(const ma_lpf2_config* pConfig, void* pHeap, ma_lpf2* pLPF)
{
    ma_result result;
    ma_biquad_config bqConfig;

    if (pLPF == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pLPF);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    bqConfig = ma_lpf2__get_biquad_config(pConfig);
    result = ma_biquad_init_preallocated(&bqConfig, pHeap, &pLPF->bq);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}